

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

void __thiscall
QOpenGLTexture::setData
          (QOpenGLTexture *this,int xOffset,int yOffset,int zOffset,int width,int height,int depth,
          int mipLevel,PixelFormat sourceFormat,PixelType sourceType,void *data,
          QOpenGLPixelTransferOptions *options)

{
  undefined8 unaff_RBX;
  int in_ESI;
  undefined8 in_RDI;
  QOpenGLTexturePrivate *unaff_R14;
  QOpenGLTexturePrivate *d;
  int in_stack_00000058;
  PixelFormat in_stack_00000078;
  PixelType in_stack_00000080;
  void *in_stack_00000088;
  QOpenGLPixelTransferOptions *in_stack_00000090;
  
  d_func((QOpenGLTexture *)0x18e65f);
  QOpenGLTexturePrivate::setData
            (unaff_R14,(int)((ulong)unaff_RBX >> 0x20),(int)unaff_RBX,(int)((ulong)in_RDI >> 0x20),
             (int)in_RDI,in_ESI,(int)d,in_stack_00000058,width,yOffset,(CubeMapFace)this,
             in_stack_00000078,in_stack_00000080,in_stack_00000088,in_stack_00000090);
  return;
}

Assistant:

void QOpenGLTexture::setData(int xOffset, int yOffset, int zOffset,
                             int width, int height, int depth,
                             int mipLevel,
                             PixelFormat sourceFormat, PixelType sourceType,
                             const void *data, const QOpenGLPixelTransferOptions * const options)
{
    Q_D(QOpenGLTexture);
    Q_ASSERT(d->textureId);
    d->setData(xOffset, yOffset, zOffset,
               width, height, depth,
               mipLevel, 0, 1,
               QOpenGLTexture::CubeMapPositiveX, sourceFormat,
               sourceType, data, options);
}